

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeKernelSetIndirectAccess
          (ze_kernel_handle_t hKernel,ze_kernel_indirect_access_flags_t flags)

{
  ze_pfnKernelSetIndirectAccess_t pfnSetIndirectAccess;
  ze_result_t result;
  ze_kernel_indirect_access_flags_t flags_local;
  ze_kernel_handle_t hKernel_local;
  
  pfnSetIndirectAccess._0_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c6c0 != (code *)0x0) {
    pfnSetIndirectAccess._0_4_ = (*DAT_0011c6c0)(hKernel,flags);
  }
  return (ze_result_t)pfnSetIndirectAccess;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeKernelSetIndirectAccess(
        ze_kernel_handle_t hKernel,                     ///< [in] handle of the kernel object
        ze_kernel_indirect_access_flags_t flags         ///< [in] kernel indirect access flags
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnSetIndirectAccess = context.zeDdiTable.Kernel.pfnSetIndirectAccess;
        if( nullptr != pfnSetIndirectAccess )
        {
            result = pfnSetIndirectAccess( hKernel, flags );
        }
        else
        {
            // generic implementation
        }

        return result;
    }